

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O1

void __thiscall Manifold_InvalidInput6_Test::TestBody(Manifold_InvalidInput6_Test *this)

{
  char cVar1;
  pointer *__ptr_2;
  pointer *__ptr;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  Manifold tet;
  MeshGL tetGL;
  AssertHelper local_148;
  Message local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  AssertHelper local_130;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  Manifold local_108 [16];
  MeshGLP<float,_unsigned_int> local_f8;
  
  TetGL();
  local_f8.triVerts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish[-1] = 7;
  manifold::Manifold::Manifold(local_108,(MeshGLP *)&local_f8);
  cVar1 = manifold::Manifold::IsEmpty();
  local_140.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_140.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,cVar1);
  local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar1 == '\0') {
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)&local_140,(AssertionResult *)"tet.IsEmpty()","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x9a,(char *)CONCAT71(local_128._1_7_,local_128[0]));
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_128._1_7_,local_128[0]),local_118._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_148.data_._4_4_,local_148.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_148.data_._4_4_,local_148.data_._0_4_) + 8))();
    }
  }
  if (local_138 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_138,local_138);
  }
  local_140.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = manifold::Manifold::Status();
  local_148.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<manifold::Manifold::Error,manifold::Manifold::Error>
            ((internal *)local_128,"tet.Status()","Manifold::Error::VertexOutOfBounds",
             (Error *)&local_140,(Error *)&local_148);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message(&local_140);
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x9b,message);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if ((long *)CONCAT44(local_140.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_140.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_140.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_140.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  manifold::Manifold::~Manifold(local_108);
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP(&local_f8);
  return;
}

Assistant:

TEST(Manifold, InvalidInput6) {
  MeshGL tetGL = TetGL();
  tetGL.triVerts[tetGL.triVerts.size() - 1] = 7;
  Manifold tet(tetGL);
  EXPECT_TRUE(tet.IsEmpty());
  EXPECT_EQ(tet.Status(), Manifold::Error::VertexOutOfBounds);
}